

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O0

void __thiscall Assimp::LoadRequest::~LoadRequest(LoadRequest *this)

{
  LoadRequest *this_local;
  
  BatchLoader::PropertyMap::~PropertyMap(&this->map);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

LoadRequest(const std::string& _file, unsigned int _flags,const BatchLoader::PropertyMap* _map, unsigned int _id)
        : file(_file)
        , flags(_flags)
        , refCnt(1)
        , scene(NULL)
        , loaded(false)
        , id(_id) {
            if ( _map ) {
                map = *_map;
            }
        }